

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

OPJ_BOOL opj_j2k_read_rgn(opj_j2k_t *p_j2k,OPJ_BYTE *p_header_data,OPJ_UINT32 p_header_size,
                         opj_event_mgr_t *p_manager)

{
  opj_tcp_t *local_68;
  OPJ_UINT32 local_5c;
  uint local_58;
  OPJ_UINT32 l_roi_sty;
  OPJ_UINT32 l_comp_no;
  OPJ_UINT32 l_comp_room;
  opj_tcp_t *l_tcp;
  opj_cp_t *l_cp;
  opj_image_t *l_image;
  opj_event_mgr_t *poStack_30;
  OPJ_UINT32 l_nb_comp;
  opj_event_mgr_t *p_manager_local;
  OPJ_BYTE *pOStack_20;
  OPJ_UINT32 p_header_size_local;
  OPJ_BYTE *p_header_data_local;
  opj_j2k_t *p_j2k_local;
  
  l_cp = (opj_cp_t *)0x0;
  l_tcp = (opj_tcp_t *)0x0;
  _l_comp_no = (opj_tcp_t *)0x0;
  poStack_30 = p_manager;
  p_manager_local._4_4_ = p_header_size;
  pOStack_20 = p_header_data;
  p_header_data_local = (OPJ_BYTE *)p_j2k;
  if (p_header_data == (OPJ_BYTE *)0x0) {
    __assert_fail("p_header_data != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x1364,
                  "OPJ_BOOL opj_j2k_read_rgn(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (p_j2k != (opj_j2k_t *)0x0) {
    if (p_manager != (opj_event_mgr_t *)0x0) {
      l_cp = (opj_cp_t *)p_j2k->m_private_image;
      l_image._4_4_ = l_cp->tdy;
      if (l_image._4_4_ < 0x101) {
        l_roi_sty = 1;
      }
      else {
        l_roi_sty = 2;
      }
      if (p_header_size == l_roi_sty + 2) {
        l_tcp = (opj_tcp_t *)&p_j2k->m_cp;
        if ((p_j2k->m_specific_param).m_decoder.m_state == 0x10) {
          local_68 = (p_j2k->m_cp).tcps + p_j2k->m_current_tile_number;
        }
        else {
          local_68 = (p_j2k->m_specific_param).m_decoder.m_default_tcp;
        }
        _l_comp_no = local_68;
        opj_read_bytes_LE(p_header_data,&local_58,l_roi_sty);
        pOStack_20 = pOStack_20 + l_roi_sty;
        opj_read_bytes_LE(pOStack_20,&local_5c,1);
        pOStack_20 = pOStack_20 + 1;
        if (local_58 < l_image._4_4_) {
          opj_read_bytes_LE(pOStack_20,(OPJ_UINT32 *)&_l_comp_no->tccps[local_58].roishift,1);
          p_j2k_local._4_4_ = 1;
        }
        else {
          opj_event_msg(poStack_30,1,"bad component number in RGN (%d when there are only %d)\n",
                        (ulong)local_58,(ulong)l_image._4_4_);
          p_j2k_local._4_4_ = 0;
        }
      }
      else {
        opj_event_msg(p_manager,1,"Error reading RGN marker\n");
        p_j2k_local._4_4_ = 0;
      }
      return p_j2k_local._4_4_;
    }
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x1366,
                  "OPJ_BOOL opj_j2k_read_rgn(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  __assert_fail("p_j2k != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                ,0x1365,
                "OPJ_BOOL opj_j2k_read_rgn(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)")
  ;
}

Assistant:

static OPJ_BOOL opj_j2k_read_rgn(opj_j2k_t *p_j2k,
                                 OPJ_BYTE * p_header_data,
                                 OPJ_UINT32 p_header_size,
                                 opj_event_mgr_t * p_manager
                                )
{
    OPJ_UINT32 l_nb_comp;
    opj_image_t * l_image = 00;

    opj_cp_t *l_cp = 00;
    opj_tcp_t *l_tcp = 00;
    OPJ_UINT32 l_comp_room, l_comp_no, l_roi_sty;

    /* preconditions*/
    assert(p_header_data != 00);
    assert(p_j2k != 00);
    assert(p_manager != 00);

    l_image = p_j2k->m_private_image;
    l_nb_comp = l_image->numcomps;

    if (l_nb_comp <= 256) {
        l_comp_room = 1;
    } else {
        l_comp_room = 2;
    }

    if (p_header_size != 2 + l_comp_room) {
        opj_event_msg(p_manager, EVT_ERROR, "Error reading RGN marker\n");
        return OPJ_FALSE;
    }

    l_cp = &(p_j2k->m_cp);
    l_tcp = (p_j2k->m_specific_param.m_decoder.m_state == J2K_STATE_TPH) ?
            &l_cp->tcps[p_j2k->m_current_tile_number] :
            p_j2k->m_specific_param.m_decoder.m_default_tcp;

    opj_read_bytes(p_header_data, &l_comp_no, l_comp_room);         /* Crgn */
    p_header_data += l_comp_room;
    opj_read_bytes(p_header_data, &l_roi_sty,
                   1);                                     /* Srgn */
    ++p_header_data;

#ifdef USE_JPWL
    if (l_cp->correct) {
        /* totlen is negative or larger than the bytes left!!! */
        if (l_comp_room >= l_nb_comp) {
            opj_event_msg(p_manager, EVT_ERROR,
                          "JPWL: bad component number in RGN (%d when there are only %d)\n",
                          l_comp_room, l_nb_comp);
            if (!JPWL_ASSUME) {
                opj_event_msg(p_manager, EVT_ERROR, "JPWL: giving up\n");
                return OPJ_FALSE;
            }
        }
    };
#endif /* USE_JPWL */

    /* testcase 3635.pdf.asan.77.2930 */
    if (l_comp_no >= l_nb_comp) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "bad component number in RGN (%d when there are only %d)\n",
                      l_comp_no, l_nb_comp);
        return OPJ_FALSE;
    }

    opj_read_bytes(p_header_data,
                   (OPJ_UINT32 *)(&(l_tcp->tccps[l_comp_no].roishift)), 1);  /* SPrgn */
    ++p_header_data;

    return OPJ_TRUE;

}